

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::calcViscosity(PeleLM *this,Real time,Real param_2,int param_3,int param_4)

{
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  int iVar1;
  int iVar2;
  long lVar3;
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *pTVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  Long LVar11;
  double *pdVar12;
  Long LVar13;
  Long LVar14;
  double *pdVar15;
  Long LVar16;
  Long LVar17;
  int n;
  TimeLevel TVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  bool bVar37;
  double dVar38;
  double dVar39;
  MFIter mfi;
  Real muloc [21];
  Real Xloc [21];
  Box local_374;
  Array4<const_double> local_358;
  Array4<double> local_318;
  Array4<const_double> local_2d8;
  MFIter local_298;
  double local_238 [22];
  double local_188 [22];
  double local_d8 [21];
  
  TVar18 = amrex::AmrLevel::which_time((AmrLevel *)this,0,time);
  pTVar4 = trans_parms.m_d_trans_parm;
  this_00 = &(&(this->super_NavierStokesBase).viscn_cc)[TVar18 != AmrOldTime]->
             super_FabArray<amrex::FArrayBox>;
  this_01 = *(FabArray<amrex::FArrayBox> **)
             (&((this->super_NavierStokesBase).super_AmrLevel.state.
                super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                super__Vector_impl_data._M_start)->new_data + (TVar18 == AmrOldTime));
  amrex::MFIter::MFIter(&local_298,&this_01->super_FabArrayBase,true);
  if (local_298.currentIndex < local_298.endIndex) {
    do {
      amrex::MFIter::growntilebox(&local_374,&local_298,-1000000);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_358,this_01,&local_298,first_spec);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_2d8,this_01,&local_298,NavierStokesBase::Temp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_318,this_00,&local_298);
      LVar17 = local_2d8.kstride;
      LVar16 = local_2d8.jstride;
      pdVar15 = local_2d8.p;
      LVar14 = local_318.kstride;
      LVar13 = local_318.jstride;
      pdVar12 = local_318.p;
      LVar11 = local_358.nstride;
      pdVar10 = local_358.p;
      iVar9 = local_374.bigend.vect[2];
      iVar8 = local_374.bigend.vect[1];
      iVar7 = local_374.bigend.vect[0];
      iVar6 = local_374.smallend.vect[1];
      iVar5 = local_374.smallend.vect[0];
      if (local_374.smallend.vect[2] <= local_374.bigend.vect[2]) {
        lVar20 = (long)local_358.begin.x;
        lVar31 = (long)local_358.begin.y;
        lVar32 = (long)local_358.begin.z;
        lVar33 = (long)local_2d8.begin.x;
        lVar34 = (long)local_2d8.begin.y;
        lVar35 = (long)local_2d8.begin.z;
        lVar30 = local_358.kstride * 8;
        lVar28 = local_358.jstride * 8;
        lVar21 = (long)local_318.begin.x;
        lVar22 = (long)local_318.begin.y;
        lVar23 = (long)local_318.begin.z;
        iVar1 = local_374.smallend.vect[2];
        do {
          if (iVar6 <= iVar8) {
            lVar24 = (long)iVar1;
            iVar2 = iVar6;
            do {
              if (iVar5 <= iVar7) {
                lVar25 = (long)iVar2;
                lVar3 = (lVar25 - lVar31) * lVar28 + (lVar24 - lVar32) * lVar30 + lVar20 * -8;
                iVar19 = iVar5;
                do {
                  lVar29 = (long)iVar19;
                  pdVar36 = (double *)((long)pdVar10 + lVar29 * 8 + lVar3);
                  pdVar26 = (double *)((long)pdVar10 + lVar29 * 8 + lVar3);
                  dVar38 = 0.0;
                  lVar27 = 0x15;
                  do {
                    dVar38 = dVar38 + *pdVar26;
                    pdVar26 = pdVar26 + LVar11;
                    lVar27 = lVar27 + -1;
                  } while (lVar27 != 0);
                  memset(local_238,0,0xa8);
                  lVar27 = 0;
                  do {
                    local_238[lVar27] = *pdVar36 * (1.0 / dVar38);
                    lVar27 = lVar27 + 1;
                    pdVar36 = pdVar36 + LVar11;
                  } while (lVar27 != 0x15);
                  dVar38 = pdVar15[(lVar24 - lVar35) * LVar17 +
                                   (lVar25 - lVar34) * LVar16 + (lVar29 - lVar33)];
                  memset(local_d8,0,0xa8);
                  memset(local_188,0,0xa8);
                  dVar38 = log(dVar38);
                  dVar39 = 0.0;
                  lVar27 = 0;
                  do {
                    dVar39 = dVar39 + local_238[lVar27];
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 0x15);
                  lVar27 = 0;
                  do {
                    local_238[lVar27] =
                         (dVar39 / 21.0 - local_238[lVar27]) * 1e-15 + local_238[lVar27];
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 0x15);
                  dVar39 = 0.0;
                  lVar27 = 0;
                  do {
                    dVar39 = dVar39 + local_238[lVar27] * (pTVar4->iwt).arr[lVar27];
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 0x15);
                  lVar27 = 0;
                  do {
                    local_d8[lVar27] =
                         local_238[lVar27] * (1.0 / dVar39) * (pTVar4->iwt).arr[lVar27];
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 0x15);
                  lVar27 = 0;
                  do {
                    dVar39 = exp(*(double *)((long)(pTVar4->fitmu).arr + lVar27 * 4 + 0x18) *
                                 dVar38 * dVar38 * dVar38 +
                                 *(double *)((long)(pTVar4->fitmu).arr + lVar27 * 4 + 0x10) *
                                 dVar38 * dVar38 +
                                 *(double *)((long)(pTVar4->fitmu).arr + lVar27 * 4 + 8) * dVar38 +
                                 *(double *)((long)(pTVar4->fitmu).arr + lVar27 * 4));
                    *(double *)((long)local_188 + lVar27) = dVar39;
                    lVar27 = lVar27 + 8;
                  } while (lVar27 != 0xa8);
                  dVar38 = 0.0;
                  lVar27 = 0;
                  do {
                    dVar39 = local_188[lVar27];
                    dVar38 = dVar38 + dVar39 * dVar39 * dVar39 * dVar39 * dVar39 * dVar39 *
                                      local_d8[lVar27];
                    lVar27 = lVar27 + 1;
                  } while (lVar27 != 0x15);
                  if (dVar38 < 0.0) {
                    dVar38 = sqrt(dVar38);
                  }
                  else {
                    dVar38 = SQRT(dVar38);
                  }
                  dVar38 = cbrt(dVar38);
                  pdVar12[(lVar24 - lVar23) * LVar14 +
                          (lVar25 - lVar22) * LVar13 + (lVar29 - lVar21)] = dVar38 * 0.1;
                  bVar37 = iVar19 != iVar7;
                  iVar19 = iVar19 + 1;
                } while (bVar37);
              }
              bVar37 = iVar2 != iVar8;
              iVar2 = iVar2 + 1;
            } while (bVar37);
          }
          bVar37 = iVar1 != iVar9;
          iVar1 = iVar1 + 1;
        } while (bVar37);
      }
      amrex::MFIter::operator++(&local_298);
    } while (local_298.currentIndex < local_298.endIndex);
  }
  amrex::MFIter::~MFIter(&local_298);
  return;
}

Assistant:

void
PeleLM::calcViscosity (const Real time,
                       const Real /*dt*/,
                       const int  /*iteration*/,
                       const int  /*ncycle*/)
{
   BL_PROFILE("PLM::calcViscosity()");

   const TimeLevel whichTime = which_time(State_Type, time);
   AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);

   MultiFab& visc = (whichTime == AmrOldTime ? *viscn_cc : *viscnp1_cc);
   // --> We assume the class state data has been properly FillPatched already !
   const MultiFab& S = (whichTime == AmrOldTime) ? get_old_data(State_Type) : get_new_data(State_Type);

   // Get the transport GPU data pointer
   auto const* ltransparm = trans_parms.device_trans_parm();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S, TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& gbx = mfi.growntilebox();
      auto const& rhoY    = S.const_array(mfi,first_spec);
      auto const& T       = S.const_array(mfi,Temp);
      auto const& mu      = visc.array(mfi);
      amrex::ParallelFor(gbx, [rhoY, T, mu, ltransparm]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         getVelViscosity( i, j, k, rhoY, T, mu, ltransparm);
      });
   }
}